

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int64_suite::test_array16_int64_two(void)

{
  value_type expected [16];
  value_type input [19];
  decoder decoder;
  value local_9c;
  value local_98 [4];
  undefined1 local_88 [12];
  undefined4 local_7c;
  uchar local_78 [32];
  decoder local_58;
  
  local_78[0] = 0xbe;
  local_78[1] = '\x10';
  local_78[2] = '\0';
  local_78[3] = '\x11';
  local_78[4] = '\"';
  local_78[5] = '3';
  local_78[6] = 'D';
  local_78[7] = 'U';
  local_78[8] = 'f';
  local_78[9] = 'w';
  local_78[10] = 0x88;
  local_78[0xb] = 0x99;
  local_78[0xc] = 0xaa;
  local_78[0xd] = 0xbb;
  local_78[0xe] = 0xcc;
  local_78[0xf] = 0xdd;
  local_78[0x10] = 0xee;
  local_78[0x11] = 0xff;
  local_78[0x12] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[19]>
            (&local_58,(uchar (*) [19])local_78);
  local_98[0] = local_58.current.code;
  local_9c = 0xbe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb06,"void compact_int64_suite::test_array16_int64_two()",local_98,&local_9c);
  local_98[0] = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_9c = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb07,"void compact_int64_suite::test_array16_int64_two()",local_98,&local_9c);
  local_98[0] = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_9c = data;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb08,"void compact_int64_suite::test_array16_int64_two()",local_98,&local_9c);
  local_98[0] = 0x44332211;
  local_98[1] = 0x88776655;
  local_98[2] = 0xccbbaa99;
  local_98[3] = 0xffeedd;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb0f,"void compact_int64_suite::test_array16_int64_two()",
             local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,local_98,local_88);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_9c = local_58.current.code;
  local_7c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb11,"void compact_int64_suite::test_array16_int64_two()",&local_9c,&local_7c);
  return;
}

Assistant:

void test_array16_int64_two()
{
    const value_type input[] = { token::code::array16_int64, 0x10, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_int64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88,
        0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}